

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O2

void Wlc_NtkPrintNtk(Wlc_Ntk_t *p)

{
  int iVar1;
  Wlc_Obj_t *pWVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  Wlc_Ntk_t *pWVar6;
  
  pWVar6 = p;
  Abc_Print((int)p,"PIs:");
  for (iVar5 = 0; iVar5 < (p->vPis).nSize; iVar5 = iVar5 + 1) {
    pWVar2 = Wlc_NtkPi(p,iVar5);
    pWVar6 = p;
    pcVar3 = Wlc_ObjName(p,(int)(((long)pWVar2 - (long)p->pObjs) / 0x18));
    Abc_Print((int)pWVar6," %s",pcVar3);
  }
  Abc_Print((int)pWVar6,"\n\n");
  Abc_Print((int)pWVar6,"POs:");
  for (iVar5 = 0; iVar5 < (p->vPos).nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(&p->vPos,iVar5);
    pWVar2 = Wlc_NtkObj(p,iVar1);
    pWVar6 = p;
    pcVar3 = Wlc_ObjName(p,(int)(((long)pWVar2 - (long)p->pObjs) / 0x18));
    Abc_Print((int)pWVar6," %s",pcVar3);
  }
  Abc_Print((int)pWVar6,"\n\n");
  Abc_Print((int)pWVar6,"FO(Fi)s:");
  for (iVar5 = 0; iVar1 = (int)pWVar6, iVar5 < (p->vCis).nSize; iVar5 = iVar5 + 1) {
    pWVar6 = p;
    pWVar2 = Wlc_NtkCi(p,iVar5);
    if ((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) !=
        (undefined1  [24])0x1) {
      pcVar3 = Wlc_ObjName(p,(int)(((long)pWVar2 - (long)p->pObjs) / 0x18));
      pWVar2 = Wlc_ObjFo2Fi(p,pWVar2);
      pWVar6 = p;
      pcVar4 = Wlc_ObjName(p,(int)(((long)pWVar2 - (long)p->pObjs) / 0x18));
      Abc_Print((int)pWVar6," %s(%s)",pcVar3,pcVar4);
    }
  }
  Abc_Print(iVar1,"\n\n");
  Abc_Print(iVar1,"Objs:\n");
  for (iVar5 = 1; iVar5 < p->iObj; iVar5 = iVar5 + 1) {
    pWVar2 = Wlc_NtkObj(p,iVar5);
    if ((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3d) !=
        (undefined1  [24])0x1) {
      Wlc_NtkPrintNode(p,pWVar2);
    }
  }
  return;
}

Assistant:

void Wlc_NtkPrintNtk( Wlc_Ntk_t * p )
{
    int i;
    Wlc_Obj_t * pObj;

    Abc_Print( 1, "PIs:");
    Wlc_NtkForEachPi( p, pObj, i )
        Abc_Print( 1, " %s", Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
    Abc_Print( 1, "\n\n");

    Abc_Print( 1, "POs:");
    Wlc_NtkForEachPo( p, pObj, i )
        Abc_Print( 1, " %s", Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
    Abc_Print( 1, "\n\n");

    Abc_Print( 1, "FO(Fi)s:");
    Wlc_NtkForEachCi( p, pObj, i )
        if ( !Wlc_ObjIsPi( pObj ) )
            Abc_Print( 1, " %s(%s)", Wlc_ObjName(p, Wlc_ObjId(p, pObj)), Wlc_ObjName(p, Wlc_ObjId(p, Wlc_ObjFo2Fi(p, pObj))) );
    Abc_Print( 1, "\n\n");

    Abc_Print( 1, "Objs:\n");
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( !Wlc_ObjIsCi(pObj) )
           Wlc_NtkPrintNode( p, pObj ) ;
    }
}